

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_register_interior(tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind)

{
  rtree_ctx_cache_elm_t *prVar1;
  rtree_ctx_cache_elm_t *prVar2;
  rtree_ctx_cache_elm_t *prVar3;
  ulong *puVar4;
  rtree_leaf_elm_t *prVar5;
  rtree_leaf_elm_t *prVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  ulong key;
  rtree_ctx_t *ctx;
  bool bVar14;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (ulong)edata->e_addr & 0xfffffffffffff000;
  uVar9 = (((edata->field_2).e_size_esn & 0xfffffffffffff000) + uVar10) - 0x2000;
  uVar10 = uVar10 + 0x1000;
  if (uVar10 <= uVar9) {
    prVar2 = ctx->l2_cache;
    prVar3 = ctx->l2_cache + 1;
    prVar7 = (rtree_leaf_elm_t *)0x0;
    key = uVar10;
    do {
      if (key == uVar10 || (key & 0x3fffffff) == 0) {
        prVar7 = (rtree_leaf_elm_t *)(key & 0xffffffffc0000000);
        uVar8 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
        puVar4 = (ulong *)((long)&ctx->cache[0].leafkey + uVar8);
        prVar5 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar8);
        if (prVar5 == prVar7) {
          prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar4[1]);
        }
        else if ((rtree_leaf_elm_t *)prVar2->leafkey == prVar7) {
          prVar6 = ctx->l2_cache[0].leaf;
          ctx->l2_cache[0].leafkey = (uintptr_t)prVar5;
          ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
          *puVar4 = (ulong)prVar7;
          puVar4[1] = (ulong)prVar6;
          prVar7 = (rtree_leaf_elm_t *)
                   ((long)&(prVar6->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
        }
        else {
          if ((rtree_leaf_elm_t *)prVar3->leafkey == prVar7) {
            uVar11 = 0;
            bVar14 = false;
            prVar13 = prVar3;
          }
          else {
            uVar8 = 1;
            prVar12 = prVar3;
            do {
              uVar11 = uVar8;
              bVar14 = 6 < uVar11;
              if (uVar11 == 7) goto LAB_01dac66b;
              prVar13 = prVar12 + 1;
              prVar1 = prVar12 + 1;
              uVar8 = uVar11 + 1;
              prVar12 = prVar13;
            } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar7);
            bVar14 = 6 < uVar11;
          }
          prVar6 = prVar13->leaf;
          prVar13->leafkey = prVar2[uVar11].leafkey;
          prVar13->leaf = ctx->l2_cache[uVar11].leaf;
          prVar2[uVar11].leafkey = (uintptr_t)prVar5;
          ctx->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar4[1];
          *puVar4 = (ulong)prVar7;
          puVar4[1] = (ulong)prVar6;
          prVar7 = (rtree_leaf_elm_t *)
                   ((long)&(prVar6->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
LAB_01dac66b:
          if (bVar14) {
            prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,key,true,false);
          }
        }
      }
      (prVar7->le_bits).repr =
           (void *)(((ulong)edata & 0xfffffffffffe) + ((ulong)szind << 0x30) + 1);
      prVar7 = prVar7 + 1;
      key = key + 0x1000;
    } while (key <= uVar9);
  }
  return;
}

Assistant:

void
emap_register_interior(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    szind_t szind) {
	EMAP_DECLARE_RTREE_CTX;

	assert(edata_slab_get(edata));
	assert(edata_state_get(edata) == extent_state_active);

	if (config_debug) {
		/* Making sure the boundary is registered already. */
		rtree_leaf_elm_t *elm_a, *elm_b;
		bool err = emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx,
		    edata, /* dependent */ true, /* init_missing */ false,
		    &elm_a, &elm_b);
		assert(!err);
		rtree_contents_t contents_a, contents_b;
		contents_a = rtree_leaf_elm_read(tsdn, &emap->rtree, elm_a,
		    /* dependent */ true);
		contents_b = rtree_leaf_elm_read(tsdn, &emap->rtree, elm_b,
		    /* dependent */ true);
		assert(contents_a.edata == edata && contents_b.edata == edata);
		assert(contents_a.metadata.slab && contents_b.metadata.slab);
	}

	rtree_contents_t contents;
	contents.edata = edata;
	contents.metadata.szind = szind;
	contents.metadata.slab = true;
	contents.metadata.state = extent_state_active;
	contents.metadata.is_head = false; /* Not allowed to access. */

	assert(edata_size_get(edata) > (2 << LG_PAGE));
	rtree_write_range(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata) + PAGE,
	    (uintptr_t)edata_last_get(edata) - PAGE, contents);
}